

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

FMFieldList copy_field_list(FMFieldList list)

{
  char **ppcVar1;
  FMFieldList p_Var2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  lVar6 = 1;
  lVar5 = 0;
  p_Var2 = list;
  do {
    lVar6 = lVar6 + -1;
    lVar5 = lVar5 + -0x100000000;
    ppcVar1 = &p_Var2->field_name;
    p_Var2 = p_Var2 + 1;
  } while (*ppcVar1 != (char *)0x0);
  p_Var2 = (FMFieldList)ffs_malloc((-lVar5 >> 0x1d) * 3);
  if (lVar6 != 0) {
    uVar3 = 1;
    if (1 < -(int)lVar6) {
      uVar3 = (ulong)(uint)-(int)lVar6;
    }
    lVar6 = 0;
    do {
      pcVar4 = strdup(*(char **)((long)&list->field_name + lVar6));
      *(char **)((long)&p_Var2->field_name + lVar6) = pcVar4;
      pcVar4 = strdup(*(char **)((long)&list->field_type + lVar6));
      *(char **)((long)&p_Var2->field_type + lVar6) = pcVar4;
      *(undefined8 *)((long)&p_Var2->field_size + lVar6) =
           *(undefined8 *)((long)&list->field_size + lVar6);
      lVar6 = lVar6 + 0x18;
    } while (uVar3 * 0x18 != lVar6);
  }
  lVar5 = -0x100000000 - lVar5 >> 0x20;
  p_Var2[lVar5].field_name = (char *)0x0;
  p_Var2[lVar5].field_type = (char *)0x0;
  p_Var2[lVar5].field_size = 0;
  p_Var2[lVar5].field_offset = 0;
  return p_Var2;
}

Assistant:

extern
FMFieldList
copy_field_list(FMFieldList list)
{
    int field_count = count_FMfield(list);
    FMFieldList new_field_list;
    int field;

    new_field_list = (FMFieldList) malloc((size_t) sizeof(FMField) *
					     (field_count + 1));
    for (field = 0; field < field_count; field++) {
	new_field_list[field].field_name = strdup(list[field].field_name);
	new_field_list[field].field_type = strdup(list[field].field_type);
	new_field_list[field].field_size = list[field].field_size;
	new_field_list[field].field_offset = list[field].field_offset;
    }
    new_field_list[field_count].field_name = NULL;
    new_field_list[field_count].field_type = NULL;
    new_field_list[field_count].field_offset = 0;
    new_field_list[field_count].field_size = 0;
    return new_field_list;
}